

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::BaseRAPass::onPerformAllSteps(BaseRAPass *this)

{
  bool bVar1;
  Error EVar2;
  Error EVar3;
  Error EVar4;
  long *in_RDI;
  Error _err_11;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  BaseRAPass *in_stack_00000158;
  BaseRAPass *in_stack_000001c8;
  BaseRAPass *in_stack_00000440;
  BaseRAPass *in_stack_000004a8;
  BaseRAPass *in_stack_000004f8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  EVar2 = (**(code **)(*in_RDI + 0x30))();
  if (((((EVar2 == 0) && (EVar2 = buildCFGViews(in_stack_000004a8), EVar2 == 0)) &&
       (EVar2 = removeUnreachableCode(in_stack_00000158), EVar2 == 0)) &&
      (((EVar2 = buildCFGDominators(__err_7), EVar2 == 0 &&
        (EVar3 = buildLiveness(in_stack_000004f8), EVar2 = EVar3, EVar3 == 0)) &&
       ((EVar4 = assignArgIndexToWorkRegs(__err_5), EVar2 = EVar4, EVar4 == 0 &&
        ((bVar1 = hasDiagnosticOption((BaseRAPass *)
                                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                      (DiagnosticOptions)((ulong)in_RDI >> 0x20)), !bVar1 ||
         (EVar2 = annotateCode(in_stack_00000440), EVar2 == 0)))))))) &&
     ((EVar2 = runGlobalAllocator((BaseRAPass *)CONCAT44(EVar3,EVar4)), EVar2 == 0 &&
      ((((EVar2 = runLocalAllocator(in_stack_000001c8), EVar2 == 0 &&
         (EVar2 = (**(code **)(*in_RDI + 0x38))(), EVar2 == 0)) &&
        (EVar2 = insertPrologEpilog((BaseRAPass *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
        EVar2 == 0)) && (EVar2 = rewrite((BaseRAPass *)0x140f43), EVar2 == 0)))))) {
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

Error BaseRAPass::onPerformAllSteps() noexcept {
  ASMJIT_PROPAGATE(buildCFG());
  ASMJIT_PROPAGATE(buildCFGViews());
  ASMJIT_PROPAGATE(removeUnreachableCode());

  ASMJIT_PROPAGATE(buildCFGDominators());
  ASMJIT_PROPAGATE(buildLiveness());
  ASMJIT_PROPAGATE(assignArgIndexToWorkRegs());

#ifndef ASMJIT_NO_LOGGING
  if (hasDiagnosticOption(DiagnosticOptions::kRAAnnotate))
    ASMJIT_PROPAGATE(annotateCode());
#endif

  ASMJIT_PROPAGATE(runGlobalAllocator());
  ASMJIT_PROPAGATE(runLocalAllocator());

  ASMJIT_PROPAGATE(updateStackFrame());
  ASMJIT_PROPAGATE(insertPrologEpilog());

  ASMJIT_PROPAGATE(rewrite());

  return kErrorOk;
}